

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O3

void trico_fill_code_double(uint8_t **out,uint64_t *xor1,uint64_t *xor2,uint64_t *bcode)

{
  uint8_t uVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  bool bVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  bool bVar7;
  uint64_t *puVar8;
  long lVar9;
  
  uVar5 = bcode[1];
  uVar6 = *bcode;
  pbVar2 = *out;
  *out = pbVar2 + 1;
  *pbVar2 = (byte)((int)uVar5 << 4) | (byte)(int)uVar6;
  lVar9 = 0;
  bVar7 = true;
  do {
    switch(bcode[lVar9]) {
    case 1:
      puVar8 = xor1 + lVar9;
      goto LAB_00112114;
    case 2:
      puVar8 = xor1 + lVar9;
      goto LAB_00112103;
    case 3:
      puVar8 = xor1 + lVar9;
      goto LAB_001120f2;
    case 4:
      puVar8 = xor1 + lVar9;
      goto LAB_001120e1;
    case 5:
      puVar8 = xor1 + lVar9;
      goto LAB_001120d0;
    case 6:
      puVar8 = xor1 + lVar9;
      goto LAB_001120bf;
    case 7:
      puVar8 = xor1 + lVar9;
      break;
    case 8:
      puVar8 = xor1 + lVar9;
      uVar1 = *(uint8_t *)((long)puVar8 + 7);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar1;
      break;
    case 9:
      puVar8 = xor2 + lVar9;
      goto LAB_00112114;
    case 10:
      puVar8 = xor2 + lVar9;
      goto LAB_00112103;
    case 0xb:
      puVar8 = xor2 + lVar9;
      goto LAB_001120f2;
    case 0xc:
      puVar8 = xor2 + lVar9;
      goto LAB_001120e1;
    case 0xd:
      puVar8 = xor2 + lVar9;
      goto LAB_001120d0;
    case 0xe:
      puVar8 = xor2 + lVar9;
      goto LAB_001120bf;
    case 0xf:
      puVar8 = xor2 + lVar9;
      break;
    default:
      goto switchD_00112045_default;
    }
    uVar1 = *(uint8_t *)((long)puVar8 + 6);
    puVar3 = *out;
    *out = puVar3 + 1;
    *puVar3 = uVar1;
LAB_001120bf:
    uVar1 = *(uint8_t *)((long)puVar8 + 5);
    puVar3 = *out;
    *out = puVar3 + 1;
    *puVar3 = uVar1;
LAB_001120d0:
    uVar1 = *(uint8_t *)((long)puVar8 + 4);
    puVar3 = *out;
    *out = puVar3 + 1;
    *puVar3 = uVar1;
LAB_001120e1:
    uVar1 = *(uint8_t *)((long)puVar8 + 3);
    puVar3 = *out;
    *out = puVar3 + 1;
    *puVar3 = uVar1;
LAB_001120f2:
    uVar1 = *(uint8_t *)((long)puVar8 + 2);
    puVar3 = *out;
    *out = puVar3 + 1;
    *puVar3 = uVar1;
LAB_00112103:
    uVar1 = *(uint8_t *)((long)puVar8 + 1);
    puVar3 = *out;
    *out = puVar3 + 1;
    *puVar3 = uVar1;
LAB_00112114:
    uVar5 = *puVar8;
    puVar3 = *out;
    *out = puVar3 + 1;
    *puVar3 = (uint8_t)uVar5;
switchD_00112045_default:
    lVar9 = 1;
    bVar4 = !bVar7;
    bVar7 = false;
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

static inline void trico_fill_code_double(uint8_t** out, uint64_t* xor1, uint64_t* xor2, uint64_t* bcode)
  {
  uint8_t bc = (uint8_t)((bcode[1] << 4) | bcode[0]);

  *(*out)++ = bc;

  for (uint32_t k = 0; k < 2; ++k)
    {
    switch (bcode[k])
      {
      case 0:
      {
      break;
      }
      case 1:
      {
      *(*out)++ = (uint8_t)(xor1[k]);
      break;
      }
      case 2:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 3:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 16));
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 4:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 24));
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 5:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 32));
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 6:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 40));
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 7:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 48));
      *(*out)++ = (uint8_t)((xor1[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 8:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 56));
      *(*out)++ = (uint8_t)((xor1[k] >> 48) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 9:
      {
      *(*out)++ = (uint8_t)(xor2[k]);
      break;
      }
      case 10:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 11:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 16));
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 12:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 24));
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 13:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 32));
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 14:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 40));
      *(*out)++ = (uint8_t)((xor2[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 15:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 48));
      *(*out)++ = (uint8_t)((xor2[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      }
    }
  }